

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O0

ExprBase * AnalyzeNew(ExpressionContext *ctx,SynNew *syntax)

{
  int iVar1;
  TypeBase *pTVar2;
  Allocator *pAVar3;
  _func_int **pp_Var4;
  FunctionData *function_00;
  IntrusiveList<TypeHandle> generics;
  ArrayView<ArgumentData> arguments_00;
  IntrusiveList<SynIdentifier> aliases;
  IntrusiveList<SynFunctionArgument> arguments_01;
  IntrusiveList<SynBase> expressions_00;
  IntrusiveList<MatchData> matches;
  ExprBase **value;
  bool bVar5;
  uint uVar6;
  SynArrayIndex *pSVar7;
  SynTypeFunction *pSVar8;
  SynCallArgument *pSVar9;
  SynTypeReference *this;
  TypeClass *pTVar10;
  SynBase *source;
  ExprBase *pEVar11;
  VariableData *pVVar12;
  ExprVariableDefinition *pEVar13;
  VariableHandle *pVVar14;
  ExprBase *third;
  TypeRef *type_00;
  ExprDereference *this_00;
  SynBase *this_01;
  SynIdentifier *this_02;
  ArrayView<FunctionValue> functions_00;
  InplaceStr IVar15;
  ArrayView<FunctionData_*> functions_01;
  ArrayView<ExprBase_*> arr;
  ArrayView<ExprBase_*> arr_00;
  ArrayView<ExprBase_*> arr_01;
  ArrayView<ExprBase*> local_d38 [16];
  ExprBase *local_d28;
  undefined1 local_d20 [8];
  SmallArray<ExprBase_*,_3U> expressions_2;
  undefined8 uStack_ce8;
  IntrusiveList<TypeHandle> local_ce0;
  undefined1 local_cd0 [12];
  ExprBase *local_cc0;
  ExprBase *call_2;
  SmallArray<ArgumentData,_32U> arguments;
  undefined1 local_688 [8];
  SmallArray<FunctionValue,_32U> functions_1;
  ExprFunctionDefinition *functionDefinition;
  MatchData *pMStack_360;
  SynBase *local_358;
  SynBase *pSStack_350;
  IntrusiveList<SynFunctionArgument> local_348;
  IntrusiveList<SynIdentifier> local_338;
  SynIdentifier *local_328;
  char *pcStack_320;
  SynIdentifier *local_310;
  SynIdentifier *nameIdentifier;
  InplaceStr name;
  ExprBase **it;
  ExprBase *function;
  TypedFunctionInstanceRequest request;
  ExprBase *definition_3;
  ExprBase *initializer_3;
  VariableData *variable_3;
  undefined4 local_2b0;
  ExprBase *local_2a8;
  undefined1 local_2a0 [8];
  SmallArray<ExprBase_*,_3U> expressions_1;
  ExprBase *copy;
  ExprBase *definition_2;
  ExprBase *initializer_2;
  VariableData *variable_2;
  undefined4 local_248;
  ExprBase *local_240;
  undefined1 local_238 [8];
  SmallArray<ExprBase_*,_3U> expressions;
  ExprBase *local_1f8;
  ExprBase *call_1;
  undefined4 local_1e8;
  ExprBase *local_1e0;
  ExprBase *overloads;
  ExprBase *definition_1;
  ExprBase *initializer_1;
  VariableData *variable_1;
  undefined1 local_1b0 [8];
  SmallArray<FunctionData_*,_32U> functions;
  TypeBase *parentType;
  TypeRef *allocType;
  ExprBase *alloc;
  ExprBase *call;
  ExprBase *definition;
  ExprBase *initializer;
  VariableData *variable;
  ExprBase *alloc_1;
  ExprBase *count;
  SynBase *syntaxInternal;
  TypeClass *typeClass;
  SynBase *curr;
  SynTypeFunction *functionType;
  SynArrayIndex *arrayIndex;
  TypeBase *type;
  SynNew *syntax_local;
  ExpressionContext *ctx_local;
  
  arrayIndex = (SynArrayIndex *)AnalyzeType(ctx,syntax->type,false,(bool *)0x0);
  if ((((TypeBase *)arrayIndex == (TypeBase *)0x0) && (syntax->count == (SynBase *)0x0)) &&
     (bVar5 = isType<SynArrayIndex>(syntax->type), bVar5)) {
    pSVar7 = getType<SynArrayIndex>(syntax->type);
    uVar6 = IntrusiveList<SynCallArgument>::size(&pSVar7->arguments);
    if ((uVar6 == 1) && (((pSVar7->arguments).head)->name == (SynIdentifier *)0x0)) {
      syntax->count = ((pSVar7->arguments).head)->value;
      syntax->type = pSVar7->value;
      arrayIndex = (SynArrayIndex *)AnalyzeType(ctx,syntax->type,false,(bool *)0x0);
    }
  }
  if (((arrayIndex == (SynArrayIndex *)0x0) &&
      (bVar5 = IntrusiveList<SynCallArgument>::empty(&syntax->arguments), bVar5)) &&
     (bVar5 = isType<SynTypeFunction>(syntax->type), bVar5)) {
    pSVar8 = getType<SynTypeFunction>(syntax->type);
    for (typeClass = (TypeClass *)(pSVar8->arguments).head; typeClass != (TypeClass *)0x0;
        typeClass = (TypeClass *)(typeClass->super_TypeStruct).super_TypeBase.size) {
      pSVar9 = ExpressionContext::get<SynCallArgument>(ctx);
      SynCallArgument::SynCallArgument
                (pSVar9,(Lexeme *)(typeClass->super_TypeStruct).super_TypeBase.name.begin,
                 (Lexeme *)(typeClass->super_TypeStruct).super_TypeBase.name.end,
                 (SynIdentifier *)0x0,(SynBase *)typeClass);
      IntrusiveList<SynCallArgument>::push_back(&syntax->arguments,pSVar9);
    }
    this = ExpressionContext::get<SynTypeReference>(ctx);
    SynTypeReference::SynTypeReference
              (this,(pSVar8->super_SynBase).begin,(pSVar8->super_SynBase).end,pSVar8->returnType);
    syntax->type = &this->super_SynBase;
    arrayIndex = (SynArrayIndex *)AnalyzeType(ctx,syntax->type,false,(bool *)0x0);
  }
  if (arrayIndex == (SynArrayIndex *)0x0) {
    AnalyzeType(ctx,syntax->type,true,(bool *)0x0);
    arrayIndex = (SynArrayIndex *)ExpressionContext::GetErrorType(ctx);
  }
  if (((arrayIndex->super_SynBase).field_0x3c & 1) != 0) {
    anon_unknown.dwarf_8df1c::Stop(ctx,syntax->type,"ERROR: generic type is not allowed");
  }
  if (((TypeBase *)arrayIndex == ctx->typeVoid) || ((TypeBase *)arrayIndex == ctx->typeAuto)) {
    anon_unknown.dwarf_8df1c::Stop
              (ctx,syntax->type,"ERROR: can\'t allocate objects of type \'%.*s\'",
               (ulong)(uint)((int)(arrayIndex->super_SynBase).end -
                            (int)(arrayIndex->super_SynBase).begin),
               (arrayIndex->super_SynBase).begin);
  }
  pTVar10 = getType<TypeClass>((TypeBase *)arrayIndex);
  if ((pTVar10 != (TypeClass *)0x0) && ((pTVar10->completed & 1U) == 0)) {
    anon_unknown.dwarf_8df1c::Stop
              (ctx,syntax->type,"ERROR: type \'%.*s\' is not fully defined",
               (ulong)(uint)((int)(arrayIndex->super_SynBase).end -
                            (int)(arrayIndex->super_SynBase).begin),
               (arrayIndex->super_SynBase).begin);
  }
  source = &ExpressionContext::MakeInternal(ctx,&syntax->super_SynBase)->super_SynBase;
  if (syntax->count == (SynBase *)0x0) {
    allocType = (TypeRef *)CreateObjectAllocation(ctx,&syntax->super_SynBase,(TypeBase *)arrayIndex)
    ;
    type_00 = getType<TypeRef>((TypeBase *)(allocType->super_TypeBase).name.end);
    functions.allocator = (Allocator *)type_00->subType;
    SmallArray<FunctionData_*,_32U>::SmallArray
              ((SmallArray<FunctionData_*,_32U> *)local_1b0,ctx->allocator);
    pAVar3 = functions.allocator;
    bVar5 = IntrusiveList<SynCallArgument>::empty(&syntax->arguments);
    bVar5 = GetTypeConstructorFunctions
                      (ctx,(TypeBase *)pAVar3,bVar5,(SmallArray<FunctionData_*,_32U> *)local_1b0);
    if (bVar5) {
      initializer_1 =
           (ExprBase *)
           anon_unknown.dwarf_8df1c::AllocateTemporary
                     (ctx,&syntax->super_SynBase,(TypeBase *)(allocType->super_TypeBase).name.end);
      pEVar11 = CreateVariableAccess(ctx,source,(VariableData *)initializer_1,false);
      definition_1 = CreateAssignment(ctx,source,pEVar11,(ExprBase *)allocType);
      pEVar13 = ExpressionContext::get<ExprVariableDefinition>(ctx);
      pTVar2 = ctx->typeVoid;
      pVVar14 = ExpressionContext::get<VariableHandle>(ctx);
      VariableHandle::VariableHandle(pVVar14,(SynBase *)0x0,(VariableData *)initializer_1);
      ExprVariableDefinition::ExprVariableDefinition(pEVar13,source,pTVar2,pVVar14,definition_1);
      overloads = &pEVar13->super_ExprBase;
      ArrayView<FunctionData*>::ArrayView<32u>
                ((ArrayView<FunctionData*> *)&call_1,(SmallArray<FunctionData_*,_32U> *)local_1b0);
      pEVar11 = CreateVariableAccess(ctx,source,(VariableData *)initializer_1,false);
      functions_01._12_4_ = 0;
      functions_01.data = (FunctionData **)call_1;
      functions_01.count = local_1e8;
      pEVar11 = CreateConstructorAccess(ctx,&syntax->super_SynBase,functions_01,pEVar11);
      local_1e0 = pEVar11;
      IntrusiveList<TypeHandle>::IntrusiveList((IntrusiveList<TypeHandle> *)&expressions.allocator);
      pSVar9 = (syntax->arguments).head;
      bVar5 = IntrusiveList<SynCallArgument>::empty(&syntax->arguments);
      local_1f8 = CreateFunctionCall(ctx,&syntax->super_SynBase,pEVar11,stack0xfffffffffffffdf8,
                                     pSVar9,bVar5);
      if (local_1f8 != (ExprBase *)0x0) {
        SmallArray<ExprBase_*,_3U>::SmallArray
                  ((SmallArray<ExprBase_*,_3U> *)local_238,ctx->allocator);
        SmallArray<ExprBase_*,_3U>::push_back((SmallArray<ExprBase_*,_3U> *)local_238,&overloads);
        SmallArray<ExprBase_*,_3U>::push_back((SmallArray<ExprBase_*,_3U> *)local_238,&local_1f8);
        local_240 = CreateVariableAccess(ctx,source,(VariableData *)initializer_1,false);
        SmallArray<ExprBase_*,_3U>::push_back((SmallArray<ExprBase_*,_3U> *)local_238,&local_240);
        allocType = (TypeRef *)ExpressionContext::get<ExprSequence>(ctx);
        pAVar3 = ctx->allocator;
        ArrayView<ExprBase*>::ArrayView<3u>
                  ((ArrayView<ExprBase*> *)&variable_2,(SmallArray<ExprBase_*,_3U> *)local_238);
        arr._12_4_ = 0;
        arr.data = (ExprBase **)variable_2;
        arr.count = local_248;
        ExprSequence::ExprSequence
                  ((ExprSequence *)allocType,pAVar3,&syntax->super_SynBase,&type_00->super_TypeBase,
                   arr);
        SmallArray<ExprBase_*,_3U>::~SmallArray((SmallArray<ExprBase_*,_3U> *)local_238);
      }
    }
    else {
      uVar6 = IntrusiveList<SynCallArgument>::size(&syntax->arguments);
      if ((uVar6 == 1) && (((syntax->arguments).head)->name == (SynIdentifier *)0x0)) {
        initializer_2 =
             (ExprBase *)
             anon_unknown.dwarf_8df1c::AllocateTemporary
                       (ctx,&syntax->super_SynBase,(TypeBase *)(allocType->super_TypeBase).name.end)
        ;
        pEVar11 = CreateVariableAccess(ctx,source,(VariableData *)initializer_2,false);
        definition_2 = CreateAssignment(ctx,source,pEVar11,(ExprBase *)allocType);
        pEVar13 = ExpressionContext::get<ExprVariableDefinition>(ctx);
        pTVar2 = ctx->typeVoid;
        pVVar14 = ExpressionContext::get<VariableHandle>(ctx);
        VariableHandle::VariableHandle(pVVar14,(SynBase *)0x0,(VariableData *)initializer_2);
        ExprVariableDefinition::ExprVariableDefinition(pEVar13,source,pTVar2,pVVar14,definition_2);
        copy = &pEVar13->super_ExprBase;
        this_00 = ExpressionContext::get<ExprDereference>(ctx);
        pAVar3 = functions.allocator;
        pEVar11 = CreateVariableAccess(ctx,source,(VariableData *)initializer_2,false);
        ExprDereference::ExprDereference(this_00,&syntax->super_SynBase,(TypeBase *)pAVar3,pEVar11);
        pEVar11 = AnalyzeExpression(ctx,((syntax->arguments).head)->value);
        expressions_1.allocator =
             (Allocator *)
             CreateAssignment(ctx,&syntax->super_SynBase,&this_00->super_ExprBase,pEVar11);
        SmallArray<ExprBase_*,_3U>::SmallArray
                  ((SmallArray<ExprBase_*,_3U> *)local_2a0,ctx->allocator);
        SmallArray<ExprBase_*,_3U>::push_back((SmallArray<ExprBase_*,_3U> *)local_2a0,&copy);
        SmallArray<ExprBase_*,_3U>::push_back
                  ((SmallArray<ExprBase_*,_3U> *)local_2a0,(ExprBase **)&expressions_1.allocator);
        local_2a8 = CreateVariableAccess(ctx,source,(VariableData *)initializer_2,false);
        SmallArray<ExprBase_*,_3U>::push_back((SmallArray<ExprBase_*,_3U> *)local_2a0,&local_2a8);
        allocType = (TypeRef *)ExpressionContext::get<ExprSequence>(ctx);
        pAVar3 = ctx->allocator;
        ArrayView<ExprBase*>::ArrayView<3u>
                  ((ArrayView<ExprBase*> *)&variable_3,(SmallArray<ExprBase_*,_3U> *)local_2a0);
        arr_00._12_4_ = 0;
        arr_00.data = (ExprBase **)variable_3;
        arr_00.count = local_2b0;
        ExprSequence::ExprSequence
                  ((ExprSequence *)allocType,pAVar3,&syntax->super_SynBase,&type_00->super_TypeBase,
                   arr_00);
        SmallArray<ExprBase_*,_3U>::~SmallArray((SmallArray<ExprBase_*,_3U> *)local_2a0);
      }
      else {
        bVar5 = IntrusiveList<SynCallArgument>::empty(&syntax->arguments);
        if (!bVar5) {
          iVar1 = *(int *)&functions.allocator[3]._vptr_Allocator;
          pp_Var4 = functions.allocator[2]._vptr_Allocator;
          IntrusiveList<SynCallArgument>::size(&syntax->arguments);
          anon_unknown.dwarf_8df1c::Stop
                    (ctx,&syntax->super_SynBase,
                     "ERROR: function \'%.*s::%.*s\' that accepts %d arguments is undefined",
                     (ulong)(uint)(iVar1 - (int)pp_Var4),pp_Var4);
        }
      }
    }
    bVar5 = IntrusiveList<SynBase>::empty(&syntax->constructor);
    if (!bVar5) {
      pVVar12 = anon_unknown.dwarf_8df1c::AllocateTemporary
                          (ctx,&syntax->super_SynBase,
                           (TypeBase *)(allocType->super_TypeBase).name.end);
      pEVar11 = CreateVariableAccess(ctx,source,pVVar12,false);
      pEVar11 = CreateAssignment(ctx,source,pEVar11,(ExprBase *)allocType);
      this_01 = (SynBase *)ExpressionContext::get<ExprVariableDefinition>(ctx);
      pTVar2 = ctx->typeVoid;
      pVVar14 = ExpressionContext::get<VariableHandle>(ctx);
      VariableHandle::VariableHandle(pVVar14,(SynBase *)0x0,pVVar12);
      ExprVariableDefinition::ExprVariableDefinition
                ((ExprVariableDefinition *)this_01,source,pTVar2,pVVar14,pEVar11);
      request.syntax = this_01;
      TypedFunctionInstanceRequest::TypedFunctionInstanceRequest
                ((TypedFunctionInstanceRequest *)&function,(TypeBase *)functions.allocator,
                 &syntax->super_SynBase);
      it = (ExprBase **)0x0;
      name.end = (char *)SmallDenseMap<TypedFunctionInstanceRequest,_ExprBase_*,_TypedFunctionInstanceRequestHasher,_32U>
                         ::find(&ctx->newConstructorFunctions,
                                (TypedFunctionInstanceRequest *)&function);
      if ((ExprBase **)name.end != (ExprBase **)0x0) {
        it = *(ExprBase ***)name.end;
      }
      if (it == (ExprBase **)0x0) {
        IVar15 = GetTemporaryFunctionName(ctx);
        name.begin = IVar15.end;
        nameIdentifier = (SynIdentifier *)IVar15.begin;
        this_02 = ExpressionContext::get<SynIdentifier>(ctx);
        local_328 = nameIdentifier;
        pcStack_320 = name.begin;
        IVar15.end = name.begin;
        IVar15.begin = (char *)nameIdentifier;
        SynIdentifier::SynIdentifier(this_02,IVar15);
        pAVar3 = functions.allocator;
        pTVar2 = ctx->typeVoid;
        local_310 = this_02;
        IntrusiveList<SynIdentifier>::IntrusiveList(&local_338);
        IntrusiveList<SynFunctionArgument>::IntrusiveList(&local_348);
        local_358 = (syntax->constructor).head;
        pSStack_350 = (syntax->constructor).tail;
        IntrusiveList<MatchData>::IntrusiveList((IntrusiveList<MatchData> *)&functionDefinition);
        aliases.tail = local_338.tail;
        aliases.head = local_338.head;
        arguments_01.tail = local_348.tail;
        arguments_01.head = local_348.head;
        expressions_00.tail = pSStack_350;
        expressions_00.head = local_358;
        matches.tail = pMStack_360;
        matches.head = (MatchData *)functionDefinition;
        it = (ExprBase **)
             CreateFunctionDefinition
                       (ctx,&syntax->super_SynBase,false,false,(TypeBase *)pAVar3,false,pTVar2,false
                        ,this_02,aliases,arguments_01,expressions_00,(FunctionData *)0x0,
                        (TypeFunction *)0x0,matches);
        SmallDenseMap<TypedFunctionInstanceRequest,_ExprBase_*,_TypedFunctionInstanceRequestHasher,_32U>
        ::insert(&ctx->newConstructorFunctions,(TypedFunctionInstanceRequest *)&function,
                 (ExprBase **)&it);
      }
      functions_1.allocator = (Allocator *)getType<ExprFunctionDefinition>((ExprBase *)it);
      SmallArray<FunctionValue,_32U>::SmallArray
                ((SmallArray<FunctionValue,_32U> *)local_688,ctx->allocator);
      function_00 = (FunctionData *)functions_1.allocator[6]._vptr_Allocator;
      pEVar11 = CreateVariableAccess(ctx,source,pVVar12,false);
      FunctionValue::FunctionValue
                ((FunctionValue *)&arguments.allocator,&syntax->super_SynBase,function_00,pEVar11);
      SmallArray<FunctionValue,_32U>::push_back
                ((SmallArray<FunctionValue,_32U> *)local_688,(FunctionValue *)&arguments.allocator);
      SmallArray<ArgumentData,_32U>::SmallArray
                ((SmallArray<ArgumentData,_32U> *)&call_2,ctx->allocator);
      value = it;
      ArrayView<FunctionValue>::ArrayView<32u>
                ((ArrayView<FunctionValue> *)local_cd0,(SmallArray<FunctionValue,_32U> *)local_688);
      IntrusiveList<TypeHandle>::IntrusiveList(&local_ce0);
      ArrayView<ArgumentData>::ArrayView<32u>
                ((ArrayView<ArgumentData> *)&expressions_2.allocator,
                 (SmallArray<ArgumentData,_32U> *)&call_2);
      generics.tail._0_4_ = (int)local_ce0.tail;
      generics.head = local_ce0.head;
      generics.tail._4_4_ = (int)((ulong)local_ce0.tail >> 0x20);
      arguments_00._8_8_ = uStack_ce8;
      arguments_00.data = (ArgumentData *)expressions_2.allocator;
      functions_00._12_4_ = 0;
      functions_00.data = (FunctionValue *)local_cd0._0_8_;
      functions_00.count = local_cd0._8_4_;
      local_cc0 = CreateFunctionCallFinal
                            (ctx,&syntax->super_SynBase,(ExprBase *)value,functions_00,generics,
                             arguments_00,false);
      SmallArray<ExprBase_*,_3U>::SmallArray((SmallArray<ExprBase_*,_3U> *)local_d20,ctx->allocator)
      ;
      SmallArray<ExprBase_*,_3U>::push_back
                ((SmallArray<ExprBase_*,_3U> *)local_d20,(ExprBase **)&request.syntax);
      SmallArray<ExprBase_*,_3U>::push_back((SmallArray<ExprBase_*,_3U> *)local_d20,&local_cc0);
      local_d28 = CreateVariableAccess(ctx,source,pVVar12,false);
      SmallArray<ExprBase_*,_3U>::push_back((SmallArray<ExprBase_*,_3U> *)local_d20,&local_d28);
      allocType = (TypeRef *)ExpressionContext::get<ExprSequence>(ctx);
      pAVar3 = ctx->allocator;
      ArrayView<ExprBase*>::ArrayView<3u>(local_d38,(SmallArray<ExprBase_*,_3U> *)local_d20);
      arr_01._12_4_ = 0;
      arr_01._0_12_ = local_d38._0_12_;
      ExprSequence::ExprSequence
                ((ExprSequence *)allocType,pAVar3,&syntax->super_SynBase,&type_00->super_TypeBase,
                 arr_01);
      SmallArray<ExprBase_*,_3U>::~SmallArray((SmallArray<ExprBase_*,_3U> *)local_d20);
      SmallArray<ArgumentData,_32U>::~SmallArray((SmallArray<ArgumentData,_32U> *)&call_2);
      SmallArray<FunctionValue,_32U>::~SmallArray((SmallArray<FunctionValue,_32U> *)local_688);
    }
    ctx_local = (ExpressionContext *)allocType;
    SmallArray<FunctionData_*,_32U>::~SmallArray((SmallArray<FunctionData_*,_32U> *)local_1b0);
  }
  else {
    bVar5 = IntrusiveList<SynCallArgument>::empty(&syntax->arguments);
    if (!bVar5) {
      anon_unknown.dwarf_8df1c::Report
                (ctx,&((syntax->arguments).head)->super_SynBase,
                 "ERROR: can\'t provide constructor arguments to array allocation");
    }
    bVar5 = IntrusiveList<SynBase>::empty(&syntax->constructor);
    if (!bVar5) {
      anon_unknown.dwarf_8df1c::Report
                (ctx,(syntax->constructor).head,
                 "ERROR: can\'t provide custom construction code for array allocation");
    }
    pEVar11 = AnalyzeExpression(ctx,syntax->count);
    ctx_local = (ExpressionContext *)
                CreateArrayAllocation(ctx,&syntax->super_SynBase,(TypeBase *)arrayIndex,pEVar11);
    bVar5 = HasDefaultConstructor(ctx,&syntax->super_SynBase,(TypeBase *)arrayIndex);
    if (bVar5) {
      pVVar12 = anon_unknown.dwarf_8df1c::AllocateTemporary
                          (ctx,&syntax->super_SynBase,(TypeBase *)ctx_local->moduleRoot);
      pEVar11 = CreateVariableAccess(ctx,source,pVVar12,false);
      pEVar11 = CreateAssignment(ctx,&syntax->super_SynBase,pEVar11,(ExprBase *)ctx_local);
      pEVar13 = ExpressionContext::get<ExprVariableDefinition>(ctx);
      pTVar2 = ctx->typeVoid;
      pVVar14 = ExpressionContext::get<VariableHandle>(ctx);
      VariableHandle::VariableHandle(pVVar14,(SynBase *)0x0,pVVar12);
      ExprVariableDefinition::ExprVariableDefinition(pEVar13,source,pTVar2,pVVar14,pEVar11);
      pTVar2 = pVVar12->type;
      pEVar11 = CreateVariableAccess(ctx,source,pVVar12,true);
      pEVar11 = CreateDefaultConstructorCall(ctx,&syntax->super_SynBase,pTVar2,pEVar11);
      if (pEVar11 != (ExprBase *)0x0) {
        third = CreateVariableAccess(ctx,source,pVVar12,true);
        ctx_local = (ExpressionContext *)
                    CreateSequence(ctx,&syntax->super_SynBase,&pEVar13->super_ExprBase,pEVar11,third
                                  );
      }
    }
  }
  return (ExprBase *)ctx_local;
}

Assistant:

ExprBase* AnalyzeNew(ExpressionContext &ctx, SynNew *syntax)
{
	TypeBase *type = AnalyzeType(ctx, syntax->type, false);

	// If there is no count and we have an array type that failed, take last extend as the size
	if(!type && !syntax->count && isType<SynArrayIndex>(syntax->type))
	{
		SynArrayIndex *arrayIndex = getType<SynArrayIndex>(syntax->type);

		if(arrayIndex->arguments.size() == 1 && !arrayIndex->arguments.head->name)
		{
			syntax->count = arrayIndex->arguments.head->value;
			syntax->type = arrayIndex->value;

			type = AnalyzeType(ctx, syntax->type, false);
		}
	}

	// If there are no arguments and we have a function type that failed, take the arguments list as constructor arguments
	if(!type && syntax->arguments.empty() && isType<SynTypeFunction>(syntax->type))
	{
		SynTypeFunction *functionType = getType<SynTypeFunction>(syntax->type);

		for(SynBase *curr = functionType->arguments.head; curr; curr = curr->next)
			syntax->arguments.push_back(new (ctx.get<SynCallArgument>()) SynCallArgument(curr->begin, curr->end, NULL, curr));

		syntax->type = new (ctx.get<SynTypeReference>()) SynTypeReference(functionType->begin, functionType->end, functionType->returnType);

		type = AnalyzeType(ctx, syntax->type, false);
	}

	// Report the original error
	if(!type)
	{
		AnalyzeType(ctx, syntax->type);

		type = ctx.GetErrorType();
	}

	if(type->isGeneric)
		Stop(ctx, syntax->type, "ERROR: generic type is not allowed");

	if(type == ctx.typeVoid || type == ctx.typeAuto)
		Stop(ctx, syntax->type, "ERROR: can't allocate objects of type '%.*s'", FMT_ISTR(type->name));

	if(TypeClass *typeClass = getType<TypeClass>(type))
	{
		if(!typeClass->completed)
			Stop(ctx, syntax->type, "ERROR: type '%.*s' is not fully defined", FMT_ISTR(type->name));
	}

	SynBase *syntaxInternal = ctx.MakeInternal(syntax);

	if(syntax->count)
	{
		if(!syntax->arguments.empty())
			Report(ctx, syntax->arguments.head, "ERROR: can't provide constructor arguments to array allocation");

		if(!syntax->constructor.empty())
			Report(ctx, syntax->constructor.head, "ERROR: can't provide custom construction code for array allocation");

		ExprBase *count = AnalyzeExpression(ctx, syntax->count);

		ExprBase *alloc = CreateArrayAllocation(ctx, syntax, type, count);

		if(HasDefaultConstructor(ctx, syntax, type))
		{
			VariableData *variable = AllocateTemporary(ctx, syntax, alloc->type);

			ExprBase *initializer = CreateAssignment(ctx, syntax, CreateVariableAccess(ctx, syntaxInternal, variable, false), alloc);
			ExprBase *definition = new (ctx.get<ExprVariableDefinition>()) ExprVariableDefinition(syntaxInternal, ctx.typeVoid, new (ctx.get<VariableHandle>()) VariableHandle(NULL, variable), initializer);

			if(ExprBase *call = CreateDefaultConstructorCall(ctx, syntax, variable->type, CreateVariableAccess(ctx, syntaxInternal, variable, true)))
				return CreateSequence(ctx, syntax, definition, call, CreateVariableAccess(ctx, syntaxInternal, variable, true));
		}

		return alloc;
	}

	ExprBase *alloc = CreateObjectAllocation(ctx, syntax, type);

	// Call constructor
	TypeRef *allocType = getType<TypeRef>(alloc->type);

	TypeBase *parentType = allocType->subType;

	SmallArray<FunctionData*, 32> functions(ctx.allocator);

	if(GetTypeConstructorFunctions(ctx, parentType, syntax->arguments.empty(), functions))
	{
		VariableData *variable = AllocateTemporary(ctx, syntax, alloc->type);

		ExprBase *initializer = CreateAssignment(ctx, syntaxInternal, CreateVariableAccess(ctx, syntaxInternal, variable, false), alloc);
		ExprBase *definition = new (ctx.get<ExprVariableDefinition>()) ExprVariableDefinition(syntaxInternal, ctx.typeVoid, new (ctx.get<VariableHandle>()) VariableHandle(NULL, variable), initializer);

		ExprBase *overloads = CreateConstructorAccess(ctx, syntax, functions, CreateVariableAccess(ctx, syntaxInternal, variable, false));

		if(ExprBase *call = CreateFunctionCall(ctx, syntax, overloads, IntrusiveList<TypeHandle>(), syntax->arguments.head, syntax->arguments.empty()))
		{
			SmallArray<ExprBase*, 3> expressions(ctx.allocator);

			expressions.push_back(definition);
			expressions.push_back(call);
			expressions.push_back(CreateVariableAccess(ctx, syntaxInternal, variable, false));

			alloc = new (ctx.get<ExprSequence>()) ExprSequence(ctx.allocator, syntax, allocType, expressions);
		}
	}
	else if(syntax->arguments.size() == 1 && !syntax->arguments.head->name)
	{
		VariableData *variable = AllocateTemporary(ctx, syntax, alloc->type);

		ExprBase *initializer = CreateAssignment(ctx, syntaxInternal, CreateVariableAccess(ctx, syntaxInternal, variable, false), alloc);
		ExprBase *definition = new (ctx.get<ExprVariableDefinition>()) ExprVariableDefinition(syntaxInternal, ctx.typeVoid, new (ctx.get<VariableHandle>()) VariableHandle(NULL, variable), initializer);

		ExprBase *copy = CreateAssignment(ctx, syntax, new (ctx.get<ExprDereference>()) ExprDereference(syntax, parentType, CreateVariableAccess(ctx, syntaxInternal, variable, false)), AnalyzeExpression(ctx, syntax->arguments.head->value));

		SmallArray<ExprBase*, 3> expressions(ctx.allocator);

		expressions.push_back(definition);
		expressions.push_back(copy);
		expressions.push_back(CreateVariableAccess(ctx, syntaxInternal, variable, false));

		alloc = new (ctx.get<ExprSequence>()) ExprSequence(ctx.allocator, syntax, allocType, expressions);
	}
	else if(!syntax->arguments.empty())
	{
		Stop(ctx, syntax, "ERROR: function '%.*s::%.*s' that accepts %d arguments is undefined", FMT_ISTR(parentType->name), FMT_ISTR(parentType->name), syntax->arguments.size());
	}

	// Handle custom constructor
	if(!syntax->constructor.empty())
	{
		VariableData *variable = AllocateTemporary(ctx, syntax, alloc->type);

		ExprBase *initializer = CreateAssignment(ctx, syntaxInternal, CreateVariableAccess(ctx, syntaxInternal, variable, false), alloc);
		ExprBase *definition = new (ctx.get<ExprVariableDefinition>()) ExprVariableDefinition(syntaxInternal, ctx.typeVoid, new (ctx.get<VariableHandle>()) VariableHandle(NULL, variable), initializer);

		TypedFunctionInstanceRequest request(parentType, syntax);

		ExprBase *function = NULL;

		if(ExprBase **it = ctx.newConstructorFunctions.find(request))
			function = *it;

		if(!function)
		{
			// Create a member function with the constructor body
			InplaceStr name = GetTemporaryFunctionName(ctx);

			SynIdentifier *nameIdentifier = new (ctx.get<SynIdentifier>()) SynIdentifier(name);

			function = CreateFunctionDefinition(ctx, syntax, false, false, parentType, false, ctx.typeVoid, false, nameIdentifier, IntrusiveList<SynIdentifier>(), IntrusiveList<SynFunctionArgument>(), syntax->constructor, NULL, NULL, IntrusiveList<MatchData>());

			ctx.newConstructorFunctions.insert(request, function);
		}

		ExprFunctionDefinition *functionDefinition = getType<ExprFunctionDefinition>(function);

		// Call this member function
		SmallArray<FunctionValue, 32> functions(ctx.allocator);
		functions.push_back(FunctionValue(syntax, functionDefinition->function, CreateVariableAccess(ctx, syntaxInternal, variable, false)));

		SmallArray<ArgumentData, 32> arguments(ctx.allocator);

		ExprBase *call = CreateFunctionCallFinal(ctx, syntax, function, functions, IntrusiveList<TypeHandle>(), arguments, false);

		SmallArray<ExprBase*, 3> expressions(ctx.allocator);

		expressions.push_back(definition);
		expressions.push_back(call);
		expressions.push_back(CreateVariableAccess(ctx, syntaxInternal, variable, false));

		alloc = new (ctx.get<ExprSequence>()) ExprSequence(ctx.allocator, syntax, allocType, expressions);
	}

	return alloc;
}